

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

FBOCache * __thiscall
Diligent::RenderDeviceGLImpl::GetFBOCache(RenderDeviceGLImpl *this,NativeGLContextType Context)

{
  mapped_type *pmVar1;
  lock_guard<Threading::SpinLock> local_20;
  SpinLockGuard FBOCacheGuard;
  NativeGLContextType Context_local;
  RenderDeviceGLImpl *this_local;
  
  FBOCacheGuard._M_device = (mutex_type *)Context;
  std::lock_guard<Threading::SpinLock>::lock_guard(&local_20,&this->m_FBOCacheLock);
  pmVar1 = std::
           unordered_map<__GLXcontextRec_*,_Diligent::FBOCache,_std::hash<__GLXcontextRec_*>,_std::equal_to<__GLXcontextRec_*>,_std::allocator<std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>_>_>
           ::operator[](&this->m_FBOCache,(key_type *)&FBOCacheGuard);
  std::lock_guard<Threading::SpinLock>::~lock_guard(&local_20);
  return pmVar1;
}

Assistant:

FBOCache& RenderDeviceGLImpl::GetFBOCache(GLContext::NativeGLContextType Context)
{
    Threading::SpinLockGuard FBOCacheGuard{m_FBOCacheLock};
    return m_FBOCache[Context];
}